

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void TestNew(_func_void_ptr_size_t *func)

{
  _func_void *p_Var1;
  new_handler saved_handler;
  _func_void_ptr_size_t *func_local;
  
  news_handled = 0;
  p_Var1 = (_func_void *)std::set_new_handler((_func_void *)0x0);
  TestOneNew(func);
  std::set_new_handler(TestNewHandler);
  TestOneNew(func);
  if (news_handled != 1) {
    printf("new_handler was not called.\n");
    abort();
  }
  std::set_new_handler(p_Var1);
  return;
}

Assistant:

static void TestNew(void* (*func)(size_t)) {
  news_handled = 0;

  // test without new_handler:
  std::new_handler saved_handler = std::set_new_handler(0);
  TestOneNew(func);

  // test with new_handler:
  std::set_new_handler(TestNewHandler);
  TestOneNew(func);
  if (news_handled != 1) {
    printf("new_handler was not called.\n");
    abort();
  }
  std::set_new_handler(saved_handler);
}